

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O3

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ContIntFromDescriptor
          (ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
           *this,uint off_L,ChVectorDynamic<> *L)

{
  ulong uVar1;
  double *pdVar2;
  
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
  ContIntFromDescriptor
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             off_L,L);
  uVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)(off_L + 3) < (long)uVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[off_L + 3] =
         (this->Rx).
         super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
         .super_ChConstraint.l_i;
    if (off_L + 4 < uVar1) {
      pdVar2[off_L + 4] =
           (this->Ru).
           super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
           .super_ChConstraint.l_i;
      if (off_L + 5 < uVar1) {
        pdVar2[off_L + 5] =
             (this->Rv).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             .super_ChConstraint.l_i;
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

virtual void ContIntFromDescriptor(const unsigned int off_L, ChVectorDynamic<>& L) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::ContIntFromDescriptor(off_L, L);

        L(off_L + 3) = Rx.Get_l_i();
        L(off_L + 4) = Ru.Get_l_i();
        L(off_L + 5) = Rv.Get_l_i();
    }